

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O2

result<toml::basic_value<toml::type_config>,_toml::error_info> *
toml::detail::parse_hex_integer<toml::type_config>
          (result<toml::basic_value<toml::type_config>,_toml::error_info> *__return_storage_ptr__,
          location *loc,context<toml::type_config> *ctx)

{
  _Alloc_hider __first;
  size_type sVar1;
  difference_type dVar2;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var3;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var4;
  basic_value<toml::type_config> *v;
  error_info *v_00;
  basic_value<toml::type_config> *ctx_00;
  string *this;
  char *pcVar5;
  string str;
  reverse_iterator<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  first_underscore;
  integer_format_info fmt;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_548;
  pointer local_528;
  reverse_iterator<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_520;
  string local_518;
  string local_4f8;
  result<long,_toml::error_info> val;
  undefined1 local_478 [200];
  region reg;
  location local_348;
  location first;
  undefined1 local_2b8 [56];
  source_location local_280;
  region local_208;
  error_info local_1a0;
  basic_value<toml::type_config> local_148;
  error_info local_80;
  
  this = &str;
  location::location(&first,loc);
  syntax::hex_int((sequence *)local_478,&ctx->toml_spec_);
  sequence::scan(&reg,(sequence *)local_478,loc);
  std::vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>::
  ~vector((vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_> *)
          (local_478 + 8));
  if (reg.source_.
      super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr == (element_type *)0x0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_4f8,
               "toml::parse_hex_integer: invalid integer: hex_int must be like: 0xC0FFEE, 0xdead_beef"
               ,(allocator<char> *)&fmt);
    syntax::hex_int((sequence *)&val,&ctx->toml_spec_);
    location::location(&local_348,loc);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_518,"",(allocator<char> *)&str);
    make_syntax_error<toml::detail::sequence>
              ((error_info *)local_478,&local_4f8,(sequence *)&val,&local_348,&local_518);
    err<toml::error_info>((failure<toml::error_info> *)&local_80,(error_info *)local_478);
    result<toml::basic_value<toml::type_config>,_toml::error_info>::result
              (__return_storage_ptr__,(failure_type *)&local_80);
    error_info::~error_info(&local_80);
    error_info::~error_info((error_info *)local_478);
    std::__cxx11::string::~string((string *)&local_518);
    location::~location(&local_348);
    std::vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>::
    ~vector((vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_> *
            )&val.field_1.succ_);
    this = &local_4f8;
  }
  else {
    region::as_string_abi_cxx11_(&str,&reg);
    integer_format_info::integer_format_info(&fmt);
    sVar1 = str._M_string_length;
    fmt.fmt = hex;
    local_478[0] = (toml)0x5f;
    dVar2 = std::
            __count_if<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                      ((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        )str._M_dataplus._M_p,
                       (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        )(str._M_dataplus._M_p + str._M_string_length),
                       (_Iter_equals_val<const_char>)local_478);
    fmt.width = (sVar1 - dVar2) - 2;
    local_520.current._M_current =
         (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          )(str._M_dataplus._M_p + str._M_string_length);
    local_528 = str._M_dataplus._M_p;
    local_478[0] = (toml)0x5f;
    std::find<std::reverse_iterator<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>,char>
              (&first_underscore,&local_520,(char *)&local_528);
    __first = str._M_dataplus;
    if (first_underscore.current._M_current !=
        (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         )str._M_dataplus._M_p) {
      fmt.spacer = (size_t)(str._M_dataplus._M_p +
                           (str._M_string_length - (long)first_underscore.current._M_current));
    }
    _Var3 = std::
            __find_if<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_pred<toml::detail::parse_hex_integer<toml::type_config>(toml::detail::location&,toml::detail::context<toml::type_config>const&)::_lambda(char)_1_>>
                      (str._M_dataplus._M_p + 2,str._M_dataplus._M_p + str._M_string_length);
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::erase
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&str,
               (__const_iterator)__first._M_p,(__const_iterator)_Var3._M_current);
    local_478[0] = (toml)0x5f;
    _Var3 = std::
            __remove_if<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                      ((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        )str._M_dataplus._M_p,
                       (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        )(str._M_dataplus._M_p + str._M_string_length),
                       (_Iter_equals_val<const_char>)local_478);
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::erase
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&str,
               (__const_iterator)_Var3._M_current,
               (__const_iterator)(str._M_dataplus._M_p + str._M_string_length));
    if (str._M_string_length == 0) {
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::assign
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&str,"0");
    }
    _Var3 = std::
            __find_if<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_pred<toml::detail::parse_hex_integer<toml::type_config>(toml::detail::location&,toml::detail::context<toml::type_config>const&)::_lambda(char)_2_>>
                      (str._M_dataplus._M_p,str._M_dataplus._M_p + str._M_string_length);
    pcVar5 = str._M_dataplus._M_p + str._M_string_length;
    _Var4 = std::
            __find_if<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_pred<toml::detail::parse_hex_integer<toml::type_config>(toml::detail::location&,toml::detail::context<toml::type_config>const&)::_lambda(char)_3_>>
                      (str._M_dataplus._M_p,pcVar5);
    fmt.uppercase =
         _Var4._M_current != str._M_dataplus._M_p + str._M_string_length ||
         _Var3._M_current == pcVar5;
    region::region((region *)local_478,loc);
    source_location::source_location(&local_280,(region *)local_478);
    type_config::parse_int(&val,&str,&local_280,'\x10');
    source_location::~source_location(&local_280);
    region::~region((region *)local_478);
    if (val.is_ok_ == true) {
      integer_format_info::integer_format_info((integer_format_info *)local_2b8,&fmt);
      local_548.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_548.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_548.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      region::region(&local_208,&reg);
      basic_value<toml::type_config>::basic_value
                ((basic_value<toml::type_config> *)local_478,(integer_type)val.field_1.succ_.value,
                 (integer_format_info *)local_2b8,&local_548,&local_208);
      ok<toml::basic_value<toml::type_config>>
                ((success<toml::basic_value<toml::type_config>_> *)&local_148,(toml *)local_478,v);
      ctx_00 = &local_148;
      result<toml::basic_value<toml::type_config>,_toml::error_info>::result
                (__return_storage_ptr__,(success_type *)ctx_00);
      basic_value<toml::type_config>::~basic_value(&local_148);
      basic_value<toml::type_config>::~basic_value((basic_value<toml::type_config> *)local_478);
      region::~region(&local_208);
      CLI::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_548);
      std::__cxx11::string::~string((string *)(local_2b8 + 0x18));
    }
    else {
      location::operator=(loc,&first);
      err<toml::error_info_const&>
                ((failure<toml::error_info> *)&local_1a0,(toml *)&val.field_1.succ_,v_00);
      ctx_00 = (basic_value<toml::type_config> *)&local_1a0;
      result<toml::basic_value<toml::type_config>,_toml::error_info>::result
                (__return_storage_ptr__,(failure_type *)&local_1a0);
      error_info::~error_info(&local_1a0);
    }
    result<long,_toml::error_info>::cleanup(&val,(EVP_PKEY_CTX *)ctx_00);
    std::__cxx11::string::~string((string *)&fmt.suffix);
  }
  std::__cxx11::string::~string((string *)this);
  region::~region(&reg);
  location::~location(&first);
  return __return_storage_ptr__;
}

Assistant:

result<basic_value<TC>, error_info>
parse_hex_integer(location& loc, const context<TC>& ctx)
{
    const auto first = loc;
    const auto& spec = ctx.toml_spec();
    auto reg = syntax::hex_int(spec).scan(loc);
    if( ! reg.is_ok())
    {
        return err(make_syntax_error("toml::parse_hex_integer: "
            "invalid integer: hex_int must be like: 0xC0FFEE, 0xdead_beef",
            syntax::hex_int(spec), loc));
    }

    auto str = reg.as_string();

    integer_format_info fmt;
    fmt.fmt   = integer_format::hex;
    fmt.width = str.size() - 2 - static_cast<std::size_t>(std::count(str.begin(), str.end(), '_'));

    const auto first_underscore = std::find(str.rbegin(), str.rend(), '_');
    if(first_underscore != str.rend())
    {
        fmt.spacer = static_cast<std::size_t>(std::distance(str.rbegin(), first_underscore));
    }

    // skip prefix `0x` and zeros and underscores at the MSB
    str.erase(str.begin(), std::find_if(
                std::next(str.begin(), 2), str.end(), [](const char c) {
                    return c != '0' && c != '_';
                }));

    // remove all `_` before calling TC::parse_int
    str.erase(std::remove(str.begin(), str.end(), '_'), str.end());

    // 0x0000_0000 becomes empty.
    if(str.empty()) { str = "0"; }

    // prefix zero and _ is removed. check if it uses upper/lower case.
    // if both upper and lower case letters are found, set upper=true.
    const auto lower_not_found = std::find_if(str.begin(), str.end(),
        [](const char c) { return std::islower(static_cast<int>(c)) != 0; }) == str.end();
    const auto upper_found = std::find_if(str.begin(), str.end(),
        [](const char c) { return std::isupper(static_cast<int>(c)) != 0; }) != str.end();
    fmt.uppercase = lower_not_found || upper_found;

    const auto val = TC::parse_int(str, source_location(region(loc)), 16);
    if(val.is_ok())
    {
        return ok(basic_value<TC>(val.as_ok(), std::move(fmt), {}, std::move(reg)));
    }
    else
    {
        loc = first;
        return err(val.as_err());
    }
}